

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string_view bloaty::ReadUntilConsuming(string_view *data,char c)

{
  string_view format;
  bool bVar1;
  const_reference pvVar2;
  char in_SIL;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string_view ret;
  char in_stack_ffffffffffffff5f;
  char *in_stack_ffffffffffffff68;
  int line;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  string_view *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined1 local_40 [39];
  char local_19;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  string_view local_10;
  
  local_19 = in_SIL;
  local_18 = in_RDI;
  local_10 = ReadUntil(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_18);
  if (!bVar1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(local_18);
    if (*pvVar2 == local_19) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(local_18,1);
      return local_10;
    }
  }
  if (local_19 == '\0') {
    Throw((char *)in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  absl::substitute_internal::Arg::Arg((Arg *)&stack0xffffffffffffff80,in_stack_ffffffffffffff5f);
  line = (int)((ulong)local_40 >> 0x20);
  format._M_str = in_stack_ffffffffffffff98;
  format._M_len = (size_t)in_stack_ffffffffffffff90;
  absl::Substitute_abi_cxx11_
            (format,(Arg *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::__cxx11::string::c_str();
  Throw((char *)in_stack_ffffffffffffff70,line);
}

Assistant:

std::string_view ReadUntilConsuming(std::string_view* data, char c) {
  std::string_view ret = ReadUntil(data, c);

  if (data->empty() || data->front() != c) {
    // Nothing left, meaning we didn't find the terminating character.
    if (c == '\0') {
      THROW("string is not NULL-terminated");
    }
    THROWF("could not find terminating character '$0'", c);
  }

  data->remove_prefix(1);  // Remove the terminating character also.
  return ret;
}